

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O0

SQRESULT declare_stream(HSQUIRRELVM v,SQChar *name,SQUserPointer typetag,SQChar *reg_name,
                       SQRegFunction *methods,SQRegFunction *globals)

{
  SQObjectType SVar1;
  SQRESULT SVar2;
  SQInteger idx;
  HSQUIRRELVM in_RCX;
  HSQUIRRELVM in_RDX;
  SQFUNCTION in_RSI;
  HSQUIRRELVM in_RDI;
  SQInteger in_R8;
  HSQUIRRELVM in_R9;
  SQRegFunction *f_1;
  SQRegFunction *f;
  SQInteger i;
  SQInteger top;
  SQChar *in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  HSQUIRRELVM in_stack_ffffffffffffffb8;
  SQChar *name_00;
  HSQUIRRELVM v_00;
  HSQUIRRELVM in_stack_fffffffffffffff8;
  
  SVar1 = sq_gettype(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
  if (SVar1 == OT_TABLE) {
    idx = sq_gettop(in_RDI);
    init_streamclass(in_stack_ffffffffffffffb0);
    sq_pushregistrytable((HSQUIRRELVM)0x144088);
    sq_pushstring(in_RDX,(SQChar *)in_RCX,in_R8);
    sq_pushstring(in_RDX,(SQChar *)in_RCX,in_R8);
    SVar2 = sq_get(in_stack_ffffffffffffffb8,(SQInteger)in_stack_ffffffffffffffb0);
    if (SVar2 < 0) {
      sq_settop(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
      SVar2 = -1;
    }
    else {
      sq_newclass(in_stack_fffffffffffffff8,(SQBool)in_RDI);
      sq_settypetag(in_R9,idx,in_stack_ffffffffffffffb8);
      for (name_00 = (SQChar *)0x0; *(long *)(in_R8 + (long)name_00 * 0x20) != 0;
          name_00 = name_00 + 1) {
        in_stack_ffffffffffffffb0 = (HSQUIRRELVM)(in_R8 + (long)name_00 * 0x20);
        sq_pushstring(in_RDX,(SQChar *)in_RCX,in_R8);
        sq_newclosure(in_RDI,in_RSI,(SQUnsignedInteger)in_RDX);
        sq_setparamscheck((HSQUIRRELVM)top,i,(SQChar *)f);
        sq_setnativeclosurename(in_R9,idx,name_00);
        sq_newslot(in_RCX,in_R8,(SQBool)in_R9);
      }
      sq_newslot(in_RCX,in_R8,(SQBool)in_R9);
      sq_pop(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
      for (v_00 = (HSQUIRRELVM)0x0;
          *(long *)((long)&(in_R9->super_SQCollectable).super_SQRefCounted + (long)v_00 * 0x20) != 0
          ; v_00 = (HSQUIRRELVM)
                   ((long)&(v_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1)) {
        in_stack_ffffffffffffffa8 =
             (SQChar *)((long)&(in_R9->super_SQCollectable).super_SQRefCounted + (long)v_00 * 0x20);
        sq_pushstring(in_RDX,(SQChar *)in_RCX,in_R8);
        sq_newclosure(in_RDI,in_RSI,(SQUnsignedInteger)in_RDX);
        sq_setparamscheck((HSQUIRRELVM)top,i,(SQChar *)f);
        sq_setnativeclosurename(in_R9,idx,(SQChar *)v_00);
        sq_newslot(in_RCX,in_R8,(SQBool)in_R9);
      }
      sq_pushstring(in_RDX,(SQChar *)in_RCX,in_R8);
      sq_pushregistrytable((HSQUIRRELVM)0x1442c2);
      sq_pushstring(in_RDX,(SQChar *)in_RCX,in_R8);
      sq_get(v_00,(SQInteger)in_stack_ffffffffffffffb0);
      sq_remove(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
      sq_newslot(in_RCX,in_R8,(SQBool)in_R9);
      sq_settop(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
      SVar2 = 0;
    }
  }
  else {
    SVar2 = sq_throwerror(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return SVar2;
}

Assistant:

SQRESULT declare_stream(HSQUIRRELVM v,const SQChar* name,SQUserPointer typetag,const SQChar* reg_name,const SQRegFunction *methods,const SQRegFunction *globals)
{
    if(sq_gettype(v,-1) != OT_TABLE)
        return sq_throwerror(v,_SC("table expected"));
    SQInteger top = sq_gettop(v);
    //create delegate
    init_streamclass(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,reg_name,-1);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-3))) {
        sq_newclass(v,SQTrue);
        sq_settypetag(v,-1,typetag);
        SQInteger i = 0;
        while(methods[i].name != 0) {
            const SQRegFunction &f = methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);

        i = 0;
        while(globals[i].name!=0)
        {
            const SQRegFunction &f = globals[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        //register the class in the target table
        sq_pushstring(v,name,-1);
        sq_pushregistrytable(v);
        sq_pushstring(v,reg_name,-1);
        sq_get(v,-2);
        sq_remove(v,-2);
        sq_newslot(v,-3,SQFalse);

        sq_settop(v,top);
        return SQ_OK;
    }
    sq_settop(v,top);
    return SQ_ERROR;
}